

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::WriteConBounds
          (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *this)

{
  NLHeader *pNVar1;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *in_RDI;
  ConBndWriter cbw;
  ConBndWriter *in_stack_00000038;
  ExampleNLFeeder *in_stack_00000040;
  ConBndWriter local_18;
  
  pNVar1 = Hdr(in_RDI);
  if ((pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons != 0) {
    pNVar1 = Hdr(in_RDI);
    TextFormatter::apr(&in_RDI->super_FormatterType,&in_RDI->nm,"r\t#%d ranges (rhs\'s)\n",
                       (ulong)(uint)(pNVar1->super_NLProblemInfo).super_NLProblemInfo_C.
                                    num_algebraic_cons);
    ConBndWriter::ConBndWriter(&local_18,in_RDI);
    Feeder(in_RDI);
    ExampleNLFeeder::
    FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::ConBndWriter>
              (in_stack_00000040,in_stack_00000038);
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteConBounds() {
  if (Hdr().num_algebraic_cons) {
		apr(nm, "r\t#%d ranges (rhs's)\n",  // and complementarity
        (int)Hdr().num_algebraic_cons);
    ConBndWriter cbw(*this);
    Feeder().FeedConBounds(cbw);
    assert((int)Hdr().num_algebraic_cons == cbw.GetNWritten());
  }
}